

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-embed.c
# Opt level: O2

int run_test_embed(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_loop_t external;
  
  iVar1 = uv_loop_init(&external);
  if (iVar1 == 0) {
    embed_timer_called = 0;
    embed_closed = 0;
    uv_async_init(&external,&embed_async,embed_cb);
    loop = uv_default_loop();
    uv_timer_init(loop,&embed_timer);
    uv_timer_start(&embed_timer,embed_timer_cb,0xfa,0);
    uv_sem_init(&embed_sem,0);
    uv_thread_create(&embed_thread,embed_thread_runner,(void *)0x0);
    uv_run(&external,UV_RUN_DEFAULT);
    uv_thread_join(&embed_thread);
    uv_loop_close(&external);
    if (embed_timer_called == 1) {
      return 0;
    }
    pcVar3 = "embed_timer_called == 1";
    uVar2 = 0x87;
  }
  else {
    pcVar3 = "0 == uv_loop_init(&external)";
    uVar2 = 0x72;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-embed.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(embed) {
#if defined(HAVE_KQUEUE) || defined(HAVE_EPOLL)
  uv_loop_t external;

  ASSERT(0 == uv_loop_init(&external));

  embed_timer_called = 0;
  embed_closed = 0;

  uv_async_init(&external, &embed_async, embed_cb);

  /* Start timer in default loop */
  uv_timer_init(uv_default_loop(), &embed_timer);
  uv_timer_start(&embed_timer, embed_timer_cb, 250, 0);

  /* Start worker that will interrupt external loop */
  uv_sem_init(&embed_sem, 0);
  uv_thread_create(&embed_thread, embed_thread_runner, NULL);

  /* But run external loop */
  uv_run(&external, UV_RUN_DEFAULT);

  uv_thread_join(&embed_thread);
  uv_loop_close(&external);

  ASSERT(embed_timer_called == 1);
#endif

  return 0;
}